

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundEmu.c
# Opt level: O2

UINT8 SndEmu_GetDeviceFunc
                (DEV_DEF *devDef,UINT8 funcType,UINT8 rwType,UINT16 user,void **retFuncPtr)

{
  DEVDEF_RWFUNC *pDVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  DEVDEF_RWFUNC *pDVar5;
  
  pDVar1 = devDef->rwFuncs;
  uVar4 = 0;
  uVar3 = 0;
  iVar2 = 0;
  while (pDVar1[uVar4].funcPtr != (void *)0x0) {
    pDVar5 = pDVar1 + uVar4;
    if (((pDVar5->funcType == funcType) && (pDVar5->rwType == rwType)) &&
       ((user == 0 || (pDVar5->user == user)))) {
      if (iVar2 == 0) {
        uVar3 = (ulong)uVar4;
      }
      iVar2 = iVar2 + 1;
    }
    uVar4 = uVar4 + 1;
  }
  if (iVar2 != 0) {
    *retFuncPtr = pDVar1[uVar3].funcPtr;
    return iVar2 != 1;
  }
  return 0xf8;
}

Assistant:

UINT8 SndEmu_GetDeviceFunc(const DEV_DEF* devDef, UINT8 funcType, UINT8 rwType, UINT16 user, void** retFuncPtr)
{
	UINT32 curFunc;
	const DEVDEF_RWFUNC* tempFnc;
	UINT32 firstFunc;
	UINT32 foundFunc;
	
	foundFunc = 0;
	firstFunc = 0;
	for (curFunc = 0; devDef->rwFuncs[curFunc].funcPtr != NULL; curFunc ++)
	{
		tempFnc = &devDef->rwFuncs[curFunc];
		if (tempFnc->funcType == funcType && tempFnc->rwType == rwType)
		{
			if (! user || user == tempFnc->user)
			{
				if (foundFunc == 0)
					firstFunc = curFunc;
				foundFunc ++;
			}
		}
	}
	if (foundFunc == 0)
		return EERR_NOT_FOUND;
	*retFuncPtr = devDef->rwFuncs[firstFunc].funcPtr;
	if (foundFunc == 1)
		return EERR_OK;
	else
		return EERR_MORE_FOUND;	// found multiple matching functions
}